

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O0

uint32_t phosg::crc32(void *vdata,size_t size,uint32_t cs)

{
  ulong uStack_30;
  uint8_t table_offset;
  size_t offset;
  uint8_t *data;
  uint32_t cs_local;
  size_t size_local;
  void *vdata_local;
  
  data._4_4_ = cs ^ 0xffffffff;
  for (uStack_30 = 0; uStack_30 < size; uStack_30 = uStack_30 + 1) {
    data._4_4_ = data._4_4_ >> 8 ^
                 *(uint *)(crc32_table +
                          (ulong)(byte)((byte)data._4_4_ ^ *(byte *)((long)vdata + uStack_30)) * 4);
  }
  return data._4_4_ ^ 0xffffffff;
}

Assistant:

uint32_t crc32(const void* vdata, size_t size, uint32_t cs) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);

  cs = ~cs;
  for (size_t offset = 0; offset < size; offset++) {
    uint8_t table_offset = cs ^ data[offset];
    cs = (cs >> 8) ^ crc32_table[table_offset];
  }
  return ~cs;
}